

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O2

int Ssw_SecGeneralMiter(Aig_Man_t *pMiter,Ssw_Pars_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Aig_Man_t *p;
  abctime aVar3;
  char *format;
  int level;
  Aig_Man_t *pAVar4;
  
  aVar2 = Abc_Clock();
  p = Ssw_SignalCorrespondence(pMiter,pPars);
  pAVar4 = p;
  iVar1 = Ssw_MiterStatus(p,1);
  level = (int)pAVar4;
  if (iVar1 == 0) {
    format = "Verification failed with a counter-example.  ";
  }
  else {
    if (iVar1 != 1) {
      Abc_Print(level,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
                (ulong)(uint)p->nRegs,(ulong)(uint)pMiter->nRegs);
      goto LAB_005115c3;
    }
    format = "Verification successful.  ";
  }
  Abc_Print(level,format);
LAB_005115c3:
  Abc_Print(level,"%s =","Time");
  aVar3 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  Aig_ManStop(p);
  return iVar1;
}

Assistant:

int Ssw_SecGeneralMiter( Aig_Man_t * pMiter, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pAigRes;
    int RetValue;
    abctime clk = Abc_Clock();
    // try the new AIGs
//    Abc_Print( 1, "Performing general verification without node pairs.\n" );
    pAigRes = Ssw_SignalCorrespondence( pMiter, pPars );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pMiter) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigRes );
    return RetValue;
}